

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

string * __thiscall
AmpIO::GetQLASerialNumber_abi_cxx11_(string *__return_storage_ptr__,AmpIO *this,uchar chan)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong local_50;
  size_t i;
  size_t QLASNSize;
  uint8_t data [20];
  uint16_t local_1c;
  uint16_t address;
  uchar chan_local;
  AmpIO *this_local;
  string *sn;
  
  local_1c = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  data[4] = '\0';
  local_50 = 0;
  do {
    if (0xb < local_50) {
LAB_00107b07:
      iVar2 = strncmp((char *)&QLASNSize,"QLA ",4);
      if ((iVar2 == 0) || (iVar2 = strncmp((char *)&QLASNSize,"dRA ",4), iVar2 == 0)) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    bVar1 = FpgaIO::PromReadByte25AA128(&this->super_FpgaIO,local_1c,data + (local_50 - 8),chan);
    if (!bVar1) {
      if (chan == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "AmpIO::GetQLASerialNumber: failed to get QLA ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)chan);
        poVar3 = std::operator<<(poVar3," Serial Number");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      goto LAB_00107b07;
    }
    if (data[local_50 - 8] == 0xff) {
      data[local_50 - 8] = '\0';
    }
    local_1c = local_1c + 1;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

std::string AmpIO::GetQLASerialNumber(unsigned char chan)
{
    // Format: QLA 1234-56 or QLA 1234-567.
    // String is terminated by 0 or 0xff.
    uint16_t address = 0x0000;
    uint8_t data[20];
    const size_t QLASNSize = 12;
    std::string sn;

    data[QLASNSize] = 0;  // make sure null-terminated
    for (size_t i = 0; i < QLASNSize; i++) {
        if (!PromReadByte25AA128(address, data[i], chan)) {
            if (chan == 0)
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA Serial Number" << std::endl;
            else
                std::cerr << "AmpIO::GetQLASerialNumber: failed to get QLA " << static_cast<unsigned int>(chan)
                          << " Serial Number" << std::endl;
            break;
        }
        if (data[i] == 0xff)
            data[i] = 0;
        address += 1;
    }
    if (strncmp((char *)data, "QLA ", 4) == 0 || strncmp((char *)data, "dRA ", 4) == 0)
        sn.assign((char *)data+4);
    return sn;
}